

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_check_ref(void)

{
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  ulong uVar5;
  long *plVar6;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  uv_check_t h;
  uv_timer_t uStack_210;
  uv_loop_t *puStack_198;
  long lStack_188;
  long lStack_180;
  uv_timer_t uStack_178;
  uv_loop_t *puStack_100;
  code *pcStack_f8;
  long lStack_e8;
  long lStack_e0;
  uv_prepare_t uStack_d8;
  uv_loop_t *puStack_80;
  long local_70;
  long local_68;
  uv_check_t local_60;
  
  puStack_80 = (uv_loop_t *)0x1b5458;
  puVar3 = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x1b5468;
  uv_check_init(puVar3,&local_60);
  puStack_80 = (uv_loop_t *)0x1b5477;
  uv_check_start(&local_60,fail_cb2);
  puStack_80 = (uv_loop_t *)0x1b547f;
  uv_unref((uv_handle_t *)&local_60);
  puStack_80 = (uv_loop_t *)0x1b5484;
  puVar3 = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x1b548e;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_80 = (uv_loop_t *)0x1b5496;
  do_close(&local_60);
  puStack_80 = (uv_loop_t *)0x1b549b;
  puVar3 = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x1b54af;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_80 = (uv_loop_t *)0x1b54b9;
  uv_run(puVar3,UV_RUN_DEFAULT);
  local_68 = 0;
  puStack_80 = (uv_loop_t *)0x1b54c7;
  puVar4 = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x1b54cf;
  iVar2 = uv_loop_close(puVar4);
  local_70 = (long)iVar2;
  if (local_68 == local_70) {
    puStack_80 = (uv_loop_t *)0x1b54e7;
    uv_library_shutdown();
    return 0;
  }
  puStack_80 = (uv_loop_t *)run_test_unref_in_prepare_cb;
  run_test_check_ref_cold_1();
  pcStack_f8 = (code *)0x1b5508;
  puStack_80 = puVar3;
  puVar3 = uv_default_loop();
  pcStack_f8 = (code *)0x1b5518;
  uv_prepare_init(puVar3,&uStack_d8);
  pcStack_f8 = (code *)0x1b5527;
  uv_prepare_start(&uStack_d8,prepare_cb);
  pcStack_f8 = (code *)0x1b552c;
  puVar3 = uv_default_loop();
  pcStack_f8 = (code *)0x1b5536;
  uv_run(puVar3,UV_RUN_DEFAULT);
  pcStack_f8 = (code *)0x1b553e;
  do_close(&uStack_d8);
  pcStack_f8 = (code *)0x1b5543;
  puVar3 = uv_default_loop();
  pcStack_f8 = (code *)0x1b5557;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  pcStack_f8 = (code *)0x1b5561;
  uv_run(puVar3,UV_RUN_DEFAULT);
  lStack_e0 = 0;
  pcStack_f8 = (code *)0x1b556f;
  puVar4 = uv_default_loop();
  pcStack_f8 = (code *)0x1b5577;
  iVar2 = uv_loop_close(puVar4);
  lStack_e8 = (long)iVar2;
  if (lStack_e0 == lStack_e8) {
    pcStack_f8 = (code *)0x1b558f;
    uv_library_shutdown();
    return 0;
  }
  plVar6 = &lStack_e0;
  pcStack_f8 = prepare_cb;
  run_test_unref_in_prepare_cb_cold_1();
  if (plVar6 != (long *)0x0) {
    uVar1 = *(uint *)(plVar6 + 7);
    uVar5 = (ulong)uVar1;
    if ((uVar1 & 8) != 0) {
      *(uint *)(plVar6 + 7) = uVar1 & 0xfffffff7;
      uVar5 = (ulong)(uVar1 & 5);
      if ((uVar1 & 5) == 4) {
        uVar5 = plVar6[1];
        *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + -1;
      }
    }
    return (int)uVar5;
  }
  puStack_100 = (uv_loop_t *)run_test_timer_ref;
  prepare_cb_cold_1();
  puStack_198 = (uv_loop_t *)0x1b55c2;
  puStack_100 = puVar3;
  puVar3 = uv_default_loop();
  puStack_198 = (uv_loop_t *)0x1b55d2;
  uv_timer_init(puVar3,&uStack_178);
  puStack_198 = (uv_loop_t *)0x1b55da;
  uv_unref((uv_handle_t *)&uStack_178);
  puStack_198 = (uv_loop_t *)0x1b55df;
  puVar3 = uv_default_loop();
  puStack_198 = (uv_loop_t *)0x1b55e9;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_198 = (uv_loop_t *)0x1b55f1;
  do_close(&uStack_178);
  puStack_198 = (uv_loop_t *)0x1b55f6;
  puVar3 = uv_default_loop();
  puStack_198 = (uv_loop_t *)0x1b560a;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_198 = (uv_loop_t *)0x1b5614;
  uv_run(puVar3,UV_RUN_DEFAULT);
  lStack_180 = 0;
  puStack_198 = (uv_loop_t *)0x1b5622;
  puVar4 = uv_default_loop();
  puStack_198 = (uv_loop_t *)0x1b562a;
  iVar2 = uv_loop_close(puVar4);
  lStack_188 = (long)iVar2;
  if (lStack_180 == lStack_188) {
    puStack_198 = (uv_loop_t *)0x1b5642;
    uv_library_shutdown();
    return 0;
  }
  puStack_198 = (uv_loop_t *)run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  puStack_198 = puVar3;
  puVar3 = uv_default_loop();
  uv_timer_init(puVar3,&uStack_210);
  uv_timer_start(&uStack_210,fail_cb,0x2a,0x2a);
  uv_unref((uv_handle_t *)&uStack_210);
  puVar3 = uv_default_loop();
  uv_run(puVar3,UV_RUN_DEFAULT);
  do_close(&uStack_210);
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,puVar3);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(check_ref) {
  uv_check_t h;
  uv_check_init(uv_default_loop(), &h);
  uv_check_start(&h, (uv_check_cb) fail_cb2);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}